

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

string * CLI::ExistingFile(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  char *__lhs;
  stat buffer;
  stat local_a0;
  
  iVar1 = stat((filename->_M_dataplus)._M_p,&local_a0);
  if (iVar1 == 0) {
    if ((local_a0.st_mode._1_1_ & 0x40) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    __lhs = "File is actually a directory: ";
  }
  else {
    __lhs = "File does not exist: ";
  }
  ::std::operator+(__return_storage_ptr__,__lhs,filename);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ExistingFile(const std::string &filename) {
    struct stat buffer;
    bool exist = stat(filename.c_str(), &buffer) == 0;
    bool is_dir = (buffer.st_mode & S_IFDIR) != 0;
    if(!exist) {
        return "File does not exist: " + filename;
    } else if(is_dir) {
        return "File is actually a directory: " + filename;
    }
    return std::string();
}